

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_function_call
          (t_cpp_generator *this,ostream *out,t_function *tfunction,string *target,string *iface,
          string *arg_prefix)

{
  t_function *ptVar1;
  bool bVar2;
  uint uVar3;
  t_type *type;
  ostream *poVar4;
  string *psVar5;
  t_struct *this_00;
  reference pptVar6;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_98;
  t_field **local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_68;
  t_type *local_48;
  t_type *ret_type;
  string *psStack_38;
  bool first;
  string *arg_prefix_local;
  string *iface_local;
  string *target_local;
  t_function *tfunction_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  ret_type._7_1_ = 1;
  psStack_38 = arg_prefix;
  arg_prefix_local = iface;
  iface_local = target;
  target_local = (string *)tfunction;
  tfunction_local = (t_function *)out;
  out_local = (ostream *)this;
  type = t_function::get_returntype(tfunction);
  local_48 = t_generator::get_true_type(type);
  ptVar1 = tfunction_local;
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  std::operator<<((ostream *)ptVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar2 = t_function::is_oneway((t_function *)target_local);
  if ((bVar2) || (uVar3 = (*(local_48->super_t_doc)._vptr_t_doc[4])(), (uVar3 & 1) != 0)) {
    poVar4 = std::operator<<((ostream *)tfunction_local,(string *)iface);
    poVar4 = std::operator<<(poVar4,"->");
    psVar5 = t_function::get_name_abi_cxx11_((t_function *)target_local);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,"(");
  }
  else {
    bVar2 = is_complex_type(this,local_48);
    if (bVar2) {
      ret_type._7_1_ = 0;
      poVar4 = std::operator<<((ostream *)tfunction_local,(string *)iface);
      poVar4 = std::operator<<(poVar4,"->");
      psVar5 = t_function::get_name_abi_cxx11_((t_function *)target_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"(");
      std::operator<<(poVar4,(string *)target);
    }
    else {
      poVar4 = std::operator<<((ostream *)tfunction_local,(string *)target);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,(string *)iface);
      poVar4 = std::operator<<(poVar4,"->");
      psVar5 = t_function::get_name_abi_cxx11_((t_function *)target_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"(");
    }
  }
  this_00 = t_function::get_arglist((t_function *)target_local);
  f_iter._M_current = (t_field **)t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_88);
  local_90 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_88._M_current = local_90;
  while( true ) {
    local_98._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_88,&local_98);
    if (!bVar2) break;
    if ((ret_type._7_1_ & 1) == 0) {
      std::operator<<((ostream *)tfunction_local,", ");
    }
    else {
      ret_type._7_1_ = 0;
    }
    poVar4 = std::operator<<((ostream *)tfunction_local,(string *)arg_prefix);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_88);
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar6);
    std::operator<<(poVar4,(string *)psVar5);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_88);
  }
  poVar4 = std::operator<<((ostream *)tfunction_local,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_function_call(ostream& out,
                                             t_function* tfunction,
                                             string target,
                                             string iface,
                                             string arg_prefix) {
  bool first = true;
  t_type* ret_type = get_true_type(tfunction->get_returntype());
  out << indent();
  if (!tfunction->is_oneway() && !ret_type->is_void()) {
    if (is_complex_type(ret_type)) {
      first = false;
      out << iface << "->" << tfunction->get_name() << "(" << target;
    } else {
      out << target << " = " << iface << "->" << tfunction->get_name() << "(";
    }
  } else {
    out << iface << "->" << tfunction->get_name() << "(";
  }
  const std::vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << arg_prefix << (*f_iter)->get_name();
  }
  out << ");" << endl;
}